

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

character_controller_ptr __thiscall
APhyBullet::BulletEngine::createKinematicCharacterController
          (BulletEngine *this,collision_object_ref *ghost_object,collision_shape_ref *convex_shape,
          aphy_scalar step_height,aphy_axis up_axis)

{
  btKinematicCharacterController *this_00;
  BulletCharacterController *this_01;
  character_controller_ptr prVar1;
  int upAxis;
  
  if (ghost_object->counter == (Counter *)0x0) {
    prVar1 = (character_controller_ptr)0x0;
  }
  else {
    prVar1 = (character_controller_ptr)0x0;
    if ((*(int *)&ghost_object->counter->object[2].super_base_interface.myRefCounter == 2) &&
       (convex_shape->counter != (Counter *)0x0)) {
      this_00 = (btKinematicCharacterController *)btAlignedAllocInternal(0xf8,0x10);
      upAxis = (up_axis != APHY_AXIS_Y) + 1;
      if (up_axis == APHY_AXIS_X) {
        upAxis = 0;
      }
      btKinematicCharacterController::btKinematicCharacterController
                (this_00,(btPairCachingGhostObject *)
                         ghost_object->counter->object[1].super_base_interface._vptr_base_interface,
                 (btConvexShape *)
                 convex_shape->counter->object[1].super_base_interface._vptr_base_interface,
                 step_height,upAxis);
      this_01 = (BulletCharacterController *)operator_new(0x28);
      BulletCharacterController::BulletCharacterController(this_01,this_00);
      prVar1 = (character_controller_ptr)operator_new(0x18);
      prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
      prVar1->object = (character_controller *)this_01;
      prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
      prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
      (this_01->super_character_controller).super_base_interface.myRefCounter = prVar1;
      aphy::ref<aphy::collision_object>::operator=(&this_01->collisionObject,ghost_object);
      aphy::ref<aphy::collision_shape>::operator=(&this_01->collisionShape,convex_shape);
    }
  }
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConeX(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShapeX(radius, height)
    ).disown();
}